

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_StartCall(InterpreterStackFrame *this,uint outParamCount)

{
  undefined8 *puVar1;
  InterpreterStackFrame *pIVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot RVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  
  puVar1 = *(undefined8 **)(this + 0x30);
  *(undefined8 **)(this + 0x30) = puVar1 + 1;
  *puVar1 = *(undefined8 *)(this + 0x28);
  *(long *)(this + 0x28) = *(long *)(this + 0x30);
  *(ulong *)(this + 0x30) = *(long *)(this + 0x30) + (ulong)outParamCount * 8;
  RVar5 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar2 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar5 * 8 + 0x160 < pIVar2) {
    RVar5 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar6 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar2 <= this + (ulong)RVar6 * 8 + (ulong)RVar5 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0xed3,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() < m_outSp && m_outSp <= (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Push");
  if (bVar4) {
    *puVar7 = 0;
    return;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void InterpreterStackFrame::OP_StartCall(uint outParamCount)
    {
        // Save the outParams for the current callsite on the outparam stack
        PushOut(m_outParams);

        // Update outParams for the indicated callsite
        m_outParams = m_outSp;

        m_outSp += outParamCount;

        AssertMsg(m_localSlots + this->m_functionBody->GetLocalsCount() < m_outSp &&
            m_outSp <= (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()),
            "out args Stack pointer not in range after Push");

    }